

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

void hwnet::http::HttpSession::onData(Ptr *ss,Ptr *buff,size_t n)

{
  HttpSession *this;
  element_type *peVar1;
  any *paVar2;
  ostream *poVar3;
  size_t sVar4;
  char *data;
  
  paVar2 = TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  this = (HttpSession *)paVar2->content[1]._vptr_placeholder;
  peVar1 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  data = ((peVar1->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->ptr + peVar1->b;
  poVar3 = std::operator<<((ostream *)&std::cout,data);
  std::endl<char,std::char_traits<char>>(poVar3);
  sVar4 = http_parser_execute(&this->parser,&this->settings,data,n);
  if (sVar4 != n) {
    TCPSocket::Close((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  Recv(this);
  return;
}

Assistant:

void HttpSession::onData(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	auto session = any_cast<HttpSession*>(ss->GetUserData());
	auto ptr = buff->BuffPtr();
	std::cout << ptr << std::endl;
	auto nparsed = http_parser_execute(&session->parser,&session->settings,ptr,n);
	if(nparsed != n) {
		onError(ss,0);
	}
	session->Recv();
}